

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageTest.cpp
# Opt level: O1

void __thiscall BaseImageTests::buffer_access::test_method(buffer_access *this)

{
  Image img1;
  shared_count sStack_238;
  Image local_230;
  undefined **local_210;
  undefined1 local_208;
  undefined8 *local_200;
  char **local_1f8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  SimpleCV::Core::Image::Image(&local_230,1,1,0);
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x1d);
  SimpleCV::Core::Image::getPixel(&local_230,0,0);
  sStack_238.pi_ = (sp_counted_base *)0x0;
  local_1f8 = &local_60;
  local_60 = "img1.getPixel(0, 0) == 0";
  local_58 = "";
  local_208 = 0;
  local_210 = &PTR__lazy_ostream_00108c88;
  local_200 = &boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_238);
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x1e);
  SimpleCV::Core::Image::getPixel(&local_230,2,0);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x1e);
  sStack_238.pi_ = (sp_counted_base *)0x0;
  local_208 = 0;
  local_210 = &PTR__lazy_ostream_00108d00;
  local_200 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = (char **)0x10613b;
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
  ;
  local_b8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_238);
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x1f);
  SimpleCV::Core::Image::getPixel(&local_230,0,2);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
  ;
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x1f);
  sStack_238.pi_ = (sp_counted_base *)0x0;
  local_208 = 0;
  local_210 = &PTR__lazy_ostream_00108d00;
  local_200 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = (char **)0x10613b;
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
  ;
  local_138 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_238);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x20);
  SimpleCV::Core::Image::getPixel(&local_230,-1,0);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x20);
  sStack_238.pi_ = (sp_counted_base *)0x0;
  local_208 = 0;
  local_210 = &PTR__lazy_ostream_00108d00;
  local_200 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = (char **)0x10613b;
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/LiMuBei[P]SimpleCV/Test/Core/ImageTest.cpp"
  ;
  local_1b8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_238);
  if (local_230.pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_230.pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_230.pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.pixels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(buffer_access)
{
	Image img1(1, 1);
	BOOST_REQUIRE(img1.getPixel(0, 0) == 0);
	BOOST_CHECK_THROW(img1.getPixel(2, 0), std::out_of_range);
	BOOST_CHECK_THROW(img1.getPixel(0, 2), std::out_of_range);
	BOOST_CHECK_THROW(img1.getPixel(-1, 0), std::out_of_range);
}